

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void list_move_node_to_tail(list *list,node *node)

{
  node *pnVar1;
  node **ppnVar2;
  
  if (node->next != (node *)0x0) {
    list_remove(list,node);
    pnVar1 = list->tail;
    if (pnVar1 != (node *)0x0 && list != (list *)0x0) {
      node->previous = pnVar1;
      if (pnVar1->next == (node *)0x0) {
        ppnVar2 = &list->tail;
      }
      else {
        node->next = pnVar1->next;
        ppnVar2 = &pnVar1->next->previous;
      }
      *ppnVar2 = node;
      pnVar1->next = node;
      list->size = list->size + 1;
    }
  }
  return;
}

Assistant:

void list_move_node_to_tail(struct list *list, struct node *node)
{
        if (node->next == NULL) {
                return;
        }

        list_remove(list, node);

        list_insert_node_after(list, list->tail, node);
}